

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void emulator_ticks_to_time(Ticks ticks,u32 *day,u32 *hr,u32 *min,u32 *sec,u32 *ms)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ulong uVar6;
  u64 secs;
  u32 *ms_local;
  u32 *sec_local;
  u32 *min_local;
  u32 *hr_local;
  u32 *day_local;
  Ticks ticks_local;
  
  uVar6 = ticks >> 0x16;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6 / 1000;
  *ms = SUB164(auVar1 % ZEXT816(1000),0);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar6;
  *sec = SUB124(auVar4 % ZEXT812(0x3c),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6 / 0x3c;
  *min = SUB164(auVar2 % ZEXT816(0x3c),0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6 / 0xe10;
  *hr = SUB164(auVar3 % ZEXT816(0x18),0);
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar6;
  *day = SUB124(auVar5 / ZEXT812(0x15180),0);
  return;
}

Assistant:

void emulator_ticks_to_time(Ticks ticks, u32* day, u32* hr, u32* min, u32* sec,
                            u32* ms) {
  u64 secs = ticks / CPU_TICKS_PER_SECOND;
  *ms = (secs / 1000) % 1000;
  *sec = secs % 60;
  *min = (secs / 60) % 60;
  *hr = (secs / (60 * 60)) % 24;
  *day = secs / (60 * 60 * 24);
}